

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_quality.cpp
# Opt level: O3

Reals __thiscall
Omega_h::measure_qualities_tmpl<3,3>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *metrics)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  LO size_in;
  size_t sVar5;
  Reals RVar6;
  Write<double> qualities;
  LOs ev2v;
  type f;
  MetricElementQualities<3,_3> measurer;
  Write<double> local_d8;
  Write<double> local_c0;
  Alloc *local_b0;
  element_type *local_a8;
  Reals local_a0;
  type local_90;
  MetricElementQualities<3,_3> local_40;
  
  local_a0.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a0.write_.shared_alloc_.alloc)->use_count =
           (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
  MetricElementQualities<3,_3>::MetricElementQualities(&local_40,mesh,&local_a0);
  pAVar3 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_a0.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  Mesh::ask_verts_of((Mesh *)&local_b0,(Int)mesh);
  pAVar3 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar5 = pAVar3->size;
  }
  else {
    sVar5 = (ulong)pAVar3 >> 3;
  }
  local_90.a2e.write_.shared_alloc_.alloc = (Alloc *)&local_90.ev2v;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  size_in = (LO)(sVar5 >> 2);
  Write<double>::Write(&local_d8,size_in,(string *)&local_90);
  if (local_90.a2e.write_.shared_alloc_.alloc != (Alloc *)&local_90.ev2v) {
    operator_delete(local_90.a2e.write_.shared_alloc_.alloc,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)&(local_90.ev2v.write_.shared_alloc_.alloc)->size)->_M_ptr +
                           1));
  }
  local_90.a2e.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)local_90.a2e.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.a2e.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.a2e.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.a2e.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.a2e.write_.shared_alloc_.alloc)->use_count =
           (local_90.a2e.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.a2e.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
  local_90.ev2v.write_.shared_alloc_.alloc = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.ev2v.write_.shared_alloc_.alloc = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  local_90.ev2v.write_.shared_alloc_.direct_ptr = local_a8;
  local_90.qualities.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_90.qualities.shared_alloc_.alloc =
           (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.qualities.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
  local_90.measurer.coords.write_.shared_alloc_.alloc = local_40.coords.write_.shared_alloc_.alloc;
  if (((ulong)local_40.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.measurer.coords.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.coords.write_.shared_alloc_.alloc)->use_count =
           (local_40.coords.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.measurer.coords.write_.shared_alloc_.direct_ptr =
       local_40.coords.write_.shared_alloc_.direct_ptr;
  local_90.measurer.metrics.write_.shared_alloc_.alloc = local_40.metrics.write_.shared_alloc_.alloc
  ;
  if (((ulong)local_40.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.measurer.metrics.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.metrics.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.metrics.write_.shared_alloc_.alloc)->use_count =
           (local_40.metrics.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.measurer.metrics.write_.shared_alloc_.direct_ptr =
       local_40.metrics.write_.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::measure_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,&local_90,"measure_qualities");
  local_c0.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
  local_c0.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
  if ((((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
       local_d8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + -1;
    local_c0.shared_alloc_.alloc = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_d8.shared_alloc_.alloc = (Alloc *)0x0;
  local_d8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_c0);
  pAVar3 = local_c0.shared_alloc_.alloc;
  if (((ulong)local_c0.shared_alloc_.alloc & 7) == 0 && local_c0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_c0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  measure_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_90);
  pAVar3 = local_d8.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    piVar1 = &local_b0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0);
      operator_delete(local_b0,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  if (((ulong)local_40.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.metrics.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.metrics.write_.shared_alloc_.alloc);
      operator_delete(local_40.metrics.write_.shared_alloc_.alloc,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  if (((ulong)local_40.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.coords.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.coords.write_.shared_alloc_.alloc);
      operator_delete(local_40.coords.write_.shared_alloc_.alloc,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals measure_qualities_tmpl(Mesh* mesh, LOs a2e, Reals metrics) {
  MetricElementQualities<mesh_dim, metric_dim> measurer(mesh, metrics);
  auto ev2v = mesh->ask_verts_of(mesh_dim);
  auto na = a2e.size();
  Write<Real> qualities(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<mesh_dim + 1>(ev2v, e);
    qualities[a] = measurer.measure(v);
  };
  parallel_for(na, f, "measure_qualities");
  return qualities;
}